

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O3

void cpp_wrapper_open_close(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value)

{
  ion_dictionary_id_t iVar1;
  ion_key_type_t iVar2;
  int32_t actual;
  int32_t actual_00;
  ion_dictionary_size_t iVar3;
  ion_dictionary_type_t iVar4;
  ion_dictionary_parent_t *piVar5;
  ion_err_t iVar6;
  planck_unit_result_t pVar7;
  ion_dictionary_config_info_t local_50;
  
  piVar5 = (dict->dict).instance;
  iVar1 = piVar5->id;
  iVar2 = piVar5->key_type;
  actual = (piVar5->record).key_size;
  actual_00 = (piVar5->record).value_size;
  iVar3 = dict->dict_size;
  iVar4 = piVar5->type;
  cpp_wrapper_insert(tc,dict,key,value,'\0');
  cpp_wrapper_get(tc,dict,key,value,'\0',1);
  iVar6 = dictionary_close(&dict->dict);
  (dict->last_status).error = iVar6;
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar6,0x44,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
                    );
  if (pVar7 != '\0') {
    local_50.use_type = '\0';
    local_50.dictionary_status = '\0';
    local_50.id = iVar1;
    local_50.type = iVar2;
    local_50.key_size = actual;
    local_50.value_size = actual_00;
    local_50.dictionary_size = iVar3;
    local_50.dictionary_type = iVar4;
    iVar6 = dictionary_open(&dict->handler,&dict->dict,&local_50);
    dict->key_type = local_50.type;
    dict->key_size = local_50.key_size;
    dict->value_size = local_50.value_size;
    dict->dict_size = local_50.dictionary_size;
    (dict->last_status).error = iVar6;
    pVar7 = planck_unit_assert_int_are_equal
                      (tc,0,(int)iVar6,0x4b,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
                      );
    if (pVar7 != '\0') {
      pVar7 = planck_unit_assert_int_are_equal
                        (tc,(((dict->dict).instance)->record).key_size,actual,0x4c,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
                        );
      if (pVar7 != '\0') {
        pVar7 = planck_unit_assert_int_are_equal
                          (tc,(((dict->dict).instance)->record).value_size,actual_00,0x4d,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
                          );
        if (pVar7 != '\0') {
          cpp_wrapper_get(tc,dict,key,value,'\0',1);
          return;
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_open_close(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int value
) {
	ion_err_t				error;
	ion_dictionary_id_t		gdict_id	= dict->dict.instance->id;
	ion_key_size_t			key_size	= dict->dict.instance->record.key_size;
	ion_value_size_t		val_size	= dict->dict.instance->record.value_size;
	ion_key_type_t			key_type	= dict->dict.instance->key_type;
	ion_dictionary_size_t	dict_size	= dict->dict_size;
	ion_dictionary_type_t	dict_type	= dict->dict.instance->type;

	/* Insert test record so we can check data integrity after we close/open */
	cpp_wrapper_insert(tc, dict, key, value, boolean_false);

	/* Check the test record */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);

	error = dict->close();

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	ion_dictionary_config_info_t config = {
		gdict_id, 0, key_type, key_size, val_size, dict_size, dict_type
	};

	error = dict->open(config);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.key_size, key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.value_size, val_size);

	/* Check the test record */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
}